

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_16_pi_d(void)

{
  ushort uVar1;
  uint addr_in;
  ulong uVar2;
  
  uVar1 = (ushort)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  uVar2 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  addr_in = *(uint *)((long)m68ki_cpu.dar + uVar2 + 0x20);
  *(uint *)((long)m68ki_cpu.dar + uVar2 + 0x20) = addr_in + 2;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_16(addr_in & m68ki_cpu.address_mask,(uint)uVar1);
  m68ki_cpu.n_flag = (uint)(uVar1 >> 8);
  m68ki_cpu.not_z_flag = (uint)uVar1;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_16_pi_d(void)
{
	uint res = MASK_OUT_ABOVE_16(DY);
	uint ea = EA_AX_PI_16();

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}